

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sequence.h
# Opt level: O3

Sequence<Protein> * __thiscall
Sequence<Protein>::Subsequence
          (Sequence<Protein> *__return_storage_ptr__,Sequence<Protein> *this,size_t pos,size_t len_)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  
  if (pos < (this->sequence)._M_string_length) {
    std::__cxx11::string::substr((ulong)&local_68,(ulong)&this->sequence);
  }
  else {
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"");
  }
  if (pos < (this->quality)._M_string_length) {
    std::__cxx11::string::substr((ulong)&local_48,(ulong)&this->quality);
  }
  else {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"");
  }
  Sequence(__return_storage_ptr__,&this->identifier,&local_68,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

Sequence< A > Sequence< A >::Subsequence( const size_t pos,
                                          const size_t len_ ) const {
  size_t len = len_;
  if( len == std::string::npos ) {
    len = Length() - pos;
  }

  return Sequence( identifier,
                   pos < sequence.length() ? sequence.substr( pos, len ) : "",
                   pos < quality.length() ? quality.substr( pos, len ) : "" );
}